

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::defineModifiables(Graph *this)

{
  bool bVar1;
  int iVar2;
  int destinyID;
  Vertex *pVVar3;
  Edge *this_00;
  Vertex *pVVar4;
  Edge *e_reverse;
  Edge *e;
  Vertex *no;
  int i;
  int n;
  Graph *this_local;
  
  resetModifiables(this);
  no._4_4_ = 1;
  for (no._0_4_ = 0; (int)no < this->edgesSize / 2; no._0_4_ = (int)no + 1) {
    for (e = (Edge *)this->verticesList; e != (Edge *)0x0; e = (Edge *)Vertex::getNext((Vertex *)e))
    {
      for (e_reverse = Vertex::getEdgesList((Vertex *)e); e_reverse != (Edge *)0x0;
          e_reverse = Edge::getNext(e_reverse)) {
        pVVar3 = Edge::getDestiny(e_reverse);
        iVar2 = Vertex::getAuxDegree(pVVar3);
        if (iVar2 == 1) {
          bVar1 = Edge::isClosed(e_reverse);
          if (bVar1) {
            bVar1 = Edge::getModifiable(e_reverse);
            if (bVar1) {
              Edge::setModifiable(e_reverse,false);
              Edge::setSwitch(e_reverse,true);
              pVVar3 = Edge::getDestiny(e_reverse);
              iVar2 = Vertex::getID(pVVar3);
              pVVar3 = Edge::getOrigin(e_reverse);
              destinyID = Vertex::getID(pVVar3);
              this_00 = findEdge(this,iVar2,destinyID);
              Edge::setModifiable(this_00,false);
              pVVar3 = Edge::getOrigin(e_reverse);
              pVVar4 = Edge::getOrigin(e_reverse);
              iVar2 = Vertex::getAuxDegree(pVVar4);
              Vertex::setAuxDegree(pVVar3,iVar2 + -1);
              pVVar3 = Edge::getDestiny(e_reverse);
              pVVar4 = Edge::getDestiny(e_reverse);
              iVar2 = Vertex::getAuxDegree(pVVar4);
              Vertex::setAuxDegree(pVVar3,iVar2 + -1);
              no._4_4_ = no._4_4_ + 1;
            }
          }
        }
      }
    }
  }
  this->numberOfNonModifiable = no._4_4_;
  return;
}

Assistant:

void Graph::defineModifiables(){

    this->resetModifiables();//define todos os arcos como sendo modificaveis
    int n=1;
    for(int i=0; i<this->edgesSize/2; i++){

        //procura arcos que conectam nos folha, esses arcos nao sao modificaveis(nao podem ser abertos)
        for(Vertex *no=this->verticesList; no!=NULL; no= no->getNext()){
            for(Edge *e= no->getEdgesList(); e!=NULL; e= e->getNext()){

                if(e->getDestiny()->getAuxDegree()==1 && e->isClosed()==true && e->getModifiable()==true){

//                    printf("\ndefinindo como nao modif A{%d}...", a->getID());

                    e->setModifiable(false);
		    e->setSwitch(true);//nao modificavel: chave sempre fechad

                    Edge *e_reverse = this->findEdge(e->getDestiny()->getID(), e->getOrigin()->getID());
                    e_reverse->setModifiable(false);

                    e->getOrigin()->setAuxDegree(e->getOrigin()->getAuxDegree() - 1);
                    e->getDestiny()->setAuxDegree(e->getDestiny()->getAuxDegree() - 1);

//                  printf("Modificaveis definidos!");

                    n++;
                }
            }
        }
    }
    this->numberOfNonModifiable = n;
//    printf("\ndefiniu arestas modificaveis!");
}